

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O1

int lws_add_http_header_by_token
              (lws *wsi,lws_token_indexes token,uchar *value,int length,uchar **p,uchar *end)

{
  uchar uVar1;
  uchar *puVar2;
  int iVar3;
  uchar *puVar4;
  size_t __n;
  bool bVar5;
  
  if ((wsi->role_ops == &role_ops_h2) || ((wsi->wsistate & 0xf000000) == 0x1000000)) {
    puVar4 = lws_token_to_string(token);
    if (puVar4 == (uchar *)0x0) {
      return 1;
    }
    iVar3 = lws_add_http2_header_by_name(wsi,puVar4,value,length,p,end);
    return iVar3;
  }
  if (token < _WSI_TOKEN_CLIENT_PEER_ADDRESS) {
    puVar4 = (uchar *)set[token];
  }
  else {
    puVar4 = (uchar *)0x0;
  }
  if (puVar4 != (uchar *)0x0) {
    if ((wsi->role_ops == &role_ops_h2) || ((wsi->wsistate & 0xf000000) == 0x1000000)) {
      iVar3 = lws_add_http2_header_by_name(wsi,puVar4,value,length,p,end);
      return iVar3;
    }
    if (puVar4 != (uchar *)0x0) {
      for (; (puVar2 = *p, puVar2 < end && (uVar1 = *puVar4, uVar1 != '\0')); puVar4 = puVar4 + 1) {
        *p = puVar2 + 1;
        *puVar2 = uVar1;
      }
      if (puVar2 == end) {
        return 1;
      }
      *p = puVar2 + 1;
      *puVar2 = ' ';
    }
    __n = (size_t)length;
    bVar5 = *p + __n + 3 < end;
    if (bVar5) {
      memcpy(*p,value,__n);
      puVar4 = *p;
      *p = puVar4 + __n + 1;
      puVar4[__n] = '\r';
      puVar4 = *p;
      *p = puVar4 + 1;
      *puVar4 = '\n';
    }
    return (uint)!bVar5;
  }
  return 1;
}

Assistant:

int
lws_add_http_header_by_token(struct lws *wsi, enum lws_token_indexes token,
			     const unsigned char *value, int length,
			     unsigned char **p, unsigned char *end)
{
	const unsigned char *name;
#ifdef LWS_WITH_HTTP2
	if (lwsi_role_h2(wsi) || lwsi_role_h2_ENCAPSULATION(wsi))
		return lws_add_http2_header_by_token(wsi, token, value,
						     length, p, end);
#endif
	name = lws_token_to_string(token);
	if (!name)
		return 1;

	return lws_add_http_header_by_name(wsi, name, value, length, p, end);
}